

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VtabFinishParse(Parse *pParse,Token *pEnd)

{
  Table *data;
  sqlite3 *db;
  Schema *pSVar1;
  int addr;
  void *pvVar2;
  char *pcVar3;
  Vdbe *p;
  Schema **ppSVar4;
  int p1;
  int p2;
  
  data = pParse->pNewTable;
  if (data != (Table *)0x0) {
    db = pParse->db;
    addArgumentToVtab(pParse);
    (pParse->sArg).z = (char *)0x0;
    if (0 < data->nModuleArg) {
      if ((db->init).busy == '\0') {
        if (pEnd != (Token *)0x0) {
          (pParse->sNameToken).n = (*(int *)&pEnd->z - *(int *)&(pParse->sNameToken).z) + pEnd->n;
        }
        pcVar3 = sqlite3MPrintf(db,"CREATE VIRTUAL TABLE %T",&pParse->sNameToken);
        if (data->pSchema == (Schema *)0x0) {
          p1 = -1000000;
        }
        else {
          p1 = -1;
          ppSVar4 = &db->aDb->pSchema;
          do {
            p1 = p1 + 1;
            pSVar1 = *ppSVar4;
            ppSVar4 = ppSVar4 + 4;
          } while (pSVar1 != data->pSchema);
        }
        sqlite3NestedParse(pParse,
                           "UPDATE %Q.%s SET type=\'table\', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q WHERE rowid=#%d"
                           ,db->aDb[p1].zDbSName,"sqlite_master",data->zName,data->zName,pcVar3,
                           (ulong)(uint)pParse->regRowid);
        if (pcVar3 != (char *)0x0) {
          sqlite3DbFreeNN(db,pcVar3);
        }
        p = sqlite3GetVdbe(pParse);
        sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,p1,1,(pParse->db->aDb[p1].pSchema)->schema_cookie + 1);
        sqlite3VdbeAddOp3(p,0x9e,0,0,0);
        pcVar3 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'table\'",data->zName);
        sqlite3VdbeAddParseSchemaOp(p,p1,pcVar3);
        p2 = pParse->nMem + 1;
        pParse->nMem = p2;
        pcVar3 = data->zName;
        addr = sqlite3VdbeAddOp3(p,0x6e,0,p2,0);
        sqlite3VdbeChangeP4(p,addr,pcVar3,0);
        sqlite3VdbeAddOp3(p,0xa1,p1,p2,0);
        return;
      }
      pvVar2 = sqlite3HashInsert(&data->pSchema->tblHash,data->zName,data);
      if (pvVar2 != (void *)0x0) {
        sqlite3OomFault(db);
        return;
      }
      pParse->pNewTable = (Table *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabFinishParse(Parse *pParse, Token *pEnd){
  Table *pTab = pParse->pNewTable;  /* The table being constructed */
  sqlite3 *db = pParse->db;         /* The database connection */

  if( pTab==0 ) return;
  addArgumentToVtab(pParse);
  pParse->sArg.z = 0;
  if( pTab->nModuleArg<1 ) return;
  
  /* If the CREATE VIRTUAL TABLE statement is being entered for the
  ** first time (in other words if the virtual table is actually being
  ** created now instead of just being read out of sqlite_master) then
  ** do additional initialization work and store the statement text
  ** in the sqlite_master table.
  */
  if( !db->init.busy ){
    char *zStmt;
    char *zWhere;
    int iDb;
    int iReg;
    Vdbe *v;

    /* Compute the complete text of the CREATE VIRTUAL TABLE statement */
    if( pEnd ){
      pParse->sNameToken.n = (int)(pEnd->z - pParse->sNameToken.z) + pEnd->n;
    }
    zStmt = sqlite3MPrintf(db, "CREATE VIRTUAL TABLE %T", &pParse->sNameToken);

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.  
    **
    ** The VM register number pParse->regRowid holds the rowid of an
    ** entry in the sqlite_master table tht was created for this vtab
    ** by sqlite3StartTable().
    */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='table', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      pTab->zName,
      pTab->zName,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    v = sqlite3GetVdbe(pParse);
    sqlite3ChangeCookie(pParse, iDb);

    sqlite3VdbeAddOp0(v, OP_Expire);
    zWhere = sqlite3MPrintf(db, "name='%q' AND type='table'", pTab->zName);
    sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere);

    iReg = ++pParse->nMem;
    sqlite3VdbeLoadString(v, iReg, pTab->zName);
    sqlite3VdbeAddOp2(v, OP_VCreate, iDb, iReg);
  }

  /* If we are rereading the sqlite_master table create the in-memory
  ** record of the table. The xConnect() method is not called until
  ** the first time the virtual table is used in an SQL statement. This
  ** allows a schema that contains virtual tables to be loaded before
  ** the required virtual table implementations are registered.  */
  else {
    Table *pOld;
    Schema *pSchema = pTab->pSchema;
    const char *zName = pTab->zName;
    assert( sqlite3SchemaMutexHeld(db, 0, pSchema) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, zName, pTab);
    if( pOld ){
      sqlite3OomFault(db);
      assert( pTab==pOld );  /* Malloc must have failed inside HashInsert() */
      return;
    }
    pParse->pNewTable = 0;
  }
}